

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryComparator
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,EBinaryComparatorOpCodes op)

{
  AsmJsType *this_00;
  AsmJsType *this_01;
  AsmJsByteCodeWriter *this_02;
  ParseNode *pnode_00;
  ParseNode *pnode_01;
  AsmJsFunc *pAVar1;
  bool bVar2;
  Types TVar3;
  RegSlot R0;
  ParseNodeBin *pPVar4;
  RegisterSpace *pRVar5;
  OpCodeAsmJs *pOVar6;
  EmitExpressionInfo EVar7;
  AsmJsCompilationException *this_03;
  EmitExpressionInfo local_40;
  EmitExpressionInfo local_38;
  EmitExpressionInfo rhsEmit;
  
  pPVar4 = ParseNode::AsParseNodeBin(pnode);
  pnode_00 = pPVar4->pnode1;
  pPVar4 = ParseNode::AsParseNodeBin(pnode);
  pnode_01 = pPVar4->pnode2;
  local_40 = Emit(this,pnode_00);
  this_00 = &local_40.type;
  local_38 = Emit(this,pnode_01);
  this_01 = &local_38.type;
  this_02 = &this->mWriter;
  ByteCodeWriter::StartStatement(&this_02->super_ByteCodeWriter,pnode,0);
  bVar2 = AsmJsType::isUnsigned(this_00);
  if (bVar2) {
    bVar2 = AsmJsType::isUnsigned(this_01);
    if (bVar2) {
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<int>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if ((local_40.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar5->mRegisterCount <= local_40.super_EmitInfoBase.location)) {
        this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_03,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_0094869c;
      }
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<int>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if ((local_38.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar5->mRegisterCount <= local_38.super_EmitInfoBase.location)) {
        this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_03,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
        goto LAB_0094869c;
      }
      R0 = GetAndReleaseBinaryLocations<int>(this,&local_40,&local_38);
      pOVar6 = (OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8 + 2);
      goto LAB_00948525;
    }
  }
  bVar2 = AsmJsType::isSigned(this_00);
  if (bVar2) {
    bVar2 = AsmJsType::isSigned(this_01);
    if (bVar2) {
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<int>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if ((local_40.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar5->mRegisterCount <= local_40.super_EmitInfoBase.location)) {
        this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_03,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_0094869c;
      }
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<int>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if ((local_38.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar5->mRegisterCount <= local_38.super_EmitInfoBase.location)) {
        this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_03,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
        goto LAB_0094869c;
      }
      R0 = GetAndReleaseBinaryLocations<int>(this,&local_40,&local_38);
      pOVar6 = (OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8);
      goto LAB_00948525;
    }
  }
  bVar2 = AsmJsType::isDouble(this_00);
  if (bVar2) {
    bVar2 = AsmJsType::isDouble(this_01);
    if (bVar2) {
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<double>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if ((local_40.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar5->mRegisterCount <= local_40.super_EmitInfoBase.location)) {
        this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_03,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_0094869c;
      }
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<double>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if ((local_38.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar5->mRegisterCount <= local_38.super_EmitInfoBase.location)) {
        this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_03,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
        goto LAB_0094869c;
      }
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<int>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      R0 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar5);
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<double>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if (local_38.super_EmitInfoBase.location != 0xffffffff) {
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar5,local_38.super_EmitInfoBase.location);
      }
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<double>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if (local_40.super_EmitInfoBase.location != 0xffffffff) {
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar5,local_40.super_EmitInfoBase.location);
      }
      pOVar6 = (OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8 + 6);
      goto LAB_00948525;
    }
  }
  bVar2 = AsmJsType::isFloat(this_00);
  if (bVar2) {
    bVar2 = AsmJsType::isFloat(this_01);
    if (bVar2) {
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<float>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if ((local_40.super_EmitInfoBase.location == 0xffffffff) ||
         (pRVar5->mRegisterCount <= local_40.super_EmitInfoBase.location)) {
        this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_03,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
      }
      else {
        pAVar1 = this->mFunction;
        TVar3 = WAsmJs::FromPrimitiveType<float>();
        pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                           (&pAVar1->mTypedRegisterAllocator,TVar3);
        if ((local_38.super_EmitInfoBase.location != 0xffffffff) &&
           (local_38.super_EmitInfoBase.location < pRVar5->mRegisterCount)) {
          pAVar1 = this->mFunction;
          TVar3 = WAsmJs::FromPrimitiveType<int>();
          pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                             (&pAVar1->mTypedRegisterAllocator,TVar3);
          R0 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar5);
          pAVar1 = this->mFunction;
          TVar3 = WAsmJs::FromPrimitiveType<float>();
          pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                             (&pAVar1->mTypedRegisterAllocator,TVar3);
          if (local_38.super_EmitInfoBase.location != 0xffffffff) {
            WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar5,local_38.super_EmitInfoBase.location);
          }
          pAVar1 = this->mFunction;
          TVar3 = WAsmJs::FromPrimitiveType<float>();
          pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                             (&pAVar1->mTypedRegisterAllocator,TVar3);
          if (local_40.super_EmitInfoBase.location != 0xffffffff) {
            WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar5,local_40.super_EmitInfoBase.location);
          }
          pOVar6 = (OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8 + 4);
LAB_00948525:
          AsmJsByteCodeWriter::AsmReg3
                    (this_02,*pOVar6,R0,local_40.super_EmitInfoBase.location,
                     local_38.super_EmitInfoBase.location);
          ByteCodeWriter::EndStatement(&this_02->super_ByteCodeWriter,pnode);
          EVar7.type.which_ = Int;
          EVar7.super_EmitInfoBase.location = R0;
          return EVar7;
        }
        this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_03,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
      }
      goto LAB_0094869c;
    }
  }
  this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
  AsmJsCompilationException::AsmJsCompilationException(this_03,L"Type not supported for comparison")
  ;
LAB_0094869c:
  __cxa_throw(this_03,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryComparator( ParseNode * pnode, EBinaryComparatorOpCodes op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* rhs = ParserWrapper::GetBinaryRight( pnode );
        const EmitExpressionInfo& lhsEmit = Emit( lhs );
        EmitExpressionInfo rhsEmit = Emit( rhs );
        const AsmJsType& lType = lhsEmit.type;
        const AsmJsType& rType = rhsEmit.type;
        StartStatement(pnode);
        EmitExpressionInfo emitInfo(AsmJsType::Int);
        OpCodeAsmJs compOp;

        if (lType.isUnsigned() && rType.isUnsigned())
        {
            CheckNodeLocation(lhsEmit, int);
            CheckNodeLocation(rhsEmit, int);
            emitInfo.location = GetAndReleaseBinaryLocations<int>(&lhsEmit, &rhsEmit);
            compOp = BinaryComparatorOpCodes[op][BCOT_UInt];
        }
        else if( lType.isSigned() && rType.isSigned() )
        {
            CheckNodeLocation( lhsEmit, int );
            CheckNodeLocation( rhsEmit, int );
            emitInfo.location = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            compOp = BinaryComparatorOpCodes[op][BCOT_Int];
        }
        else if( lType.isDouble() && rType.isDouble() )
        {
            CheckNodeLocation( lhsEmit, double );
            CheckNodeLocation( rhsEmit, double );
            emitInfo.location = mFunction->AcquireTmpRegister<int>();
            mFunction->ReleaseLocation<double>( &rhsEmit );
            mFunction->ReleaseLocation<double>( &lhsEmit );
            compOp = BinaryComparatorOpCodes[op][BCOT_Double];
        }
        else if (lType.isFloat() && rType.isFloat())
        {
            CheckNodeLocation(lhsEmit, float);
            CheckNodeLocation(rhsEmit, float);
            emitInfo.location = mFunction->AcquireTmpRegister<int>();
            mFunction->ReleaseLocation<float>(&rhsEmit);
            mFunction->ReleaseLocation<float>(&lhsEmit);
            compOp = BinaryComparatorOpCodes[op][BCOT_Float];
        }
        else
        {
            throw AsmJsCompilationException( _u("Type not supported for comparison") );
        }
        mWriter.AsmReg3( compOp, emitInfo.location, lhsEmit.location, rhsEmit.location );
        EndStatement(pnode);
        return emitInfo;
    }